

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

DdNode * cuddHashTableLookup1(DdHashTable *hash,DdNode *f)

{
  ptrint *ppVar1;
  int *piVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdHashItem *pDVar5;
  DdHashItem *pDVar6;
  ulong uVar7;
  DdHashItem *pDVar8;
  DdHashItem **ppDVar9;
  
  uVar7 = (ulong)((((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2) *
                  0x7c45abd6 >> ((byte)hash->shift & 0x1f));
  pDVar4 = (DdNode *)hash->bucket;
  pDVar8 = (DdHashItem *)0x0;
  pDVar5 = *(DdHashItem **)(&pDVar4->index + uVar7 * 2);
  do {
    if (pDVar5 == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar3 = pDVar5->key[0];
    if (pDVar3 == f) {
      pDVar4 = pDVar5->value;
      ppVar1 = &pDVar5->count;
      *ppVar1 = *ppVar1 + -1;
      pDVar6 = pDVar5;
      if (*ppVar1 == 0) {
        piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + -1;
        ppDVar9 = &pDVar8->next;
        if (pDVar8 == (DdHashItem *)0x0) {
          ppDVar9 = hash->bucket + uVar7;
        }
        *ppDVar9 = pDVar5->next;
        pDVar5->next = hash->nextFree;
        hash->nextFree = pDVar5;
        hash->size = hash->size - 1;
      }
    }
    else {
      pDVar6 = pDVar5->next;
      pDVar8 = pDVar5;
    }
    pDVar5 = pDVar6;
  } while (pDVar3 != f);
  return pDVar4;
}

Assistant:

DdNode *
cuddHashTableLookup1(
  DdHashTable * hash,
  DdNode * f)
{
    unsigned int posn;
    DdHashItem *item, *prev;

#ifdef DD_DEBUG
    assert(hash->keysize == 1);
#endif

    posn = ddLCHash2(cuddF2L(f),cuddF2L(f),hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    while (item != NULL) {
        DdNodePtr *key = item->key;
        if (f == key[0]) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}